

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O2

uint32_t aom_rb_read_uvlc(aom_read_bit_buffer *rb)

{
  int iVar1;
  int bits;
  
  bits = 0;
  while( true ) {
    if (bits == 0x20) {
      return 0xffffffff;
    }
    iVar1 = aom_rb_read_bit(rb);
    if (iVar1 != 0) break;
    bits = bits + 1;
  }
  iVar1 = aom_rb_read_literal(rb,bits);
  return iVar1 + ~(-1 << ((byte)bits & 0x1f));
}

Assistant:

uint32_t aom_rb_read_uvlc(struct aom_read_bit_buffer *rb) {
  int leading_zeros = 0;
  while (leading_zeros < 32 && !aom_rb_read_bit(rb)) ++leading_zeros;
  // Maximum 32 bits.
  if (leading_zeros == 32) return UINT32_MAX;
  const uint32_t base = (1u << leading_zeros) - 1;
  const uint32_t value = aom_rb_read_literal(rb, leading_zeros);
  return base + value;
}